

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Chapters::Edition::ExpandAtomsArray(Edition *this)

{
  Atom *pAVar1;
  int iVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ulong *puVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  Atom *pAVar10;
  
  iVar2 = this->m_atoms_size;
  bVar4 = true;
  if (iVar2 <= this->m_atoms_count) {
    iVar7 = 1;
    if (iVar2 != 0) {
      iVar7 = iVar2 * 2;
    }
    uVar9 = (ulong)iVar7;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x30),8) == 0) {
      uVar6 = SUB168(auVar3 * ZEXT816(0x30),0) | 8;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    if (puVar5 == (ulong *)0x0) {
      bVar4 = false;
    }
    else {
      *puVar5 = uVar9;
      pAVar1 = (Atom *)(puVar5 + 1);
      lVar8 = 0;
      pAVar10 = pAVar1;
      do {
        Atom::Atom(pAVar10);
        lVar8 = lVar8 + -0x30;
        pAVar10 = pAVar10 + 1;
      } while (uVar9 * -0x30 - lVar8 != 0);
      pAVar10 = this->m_atoms;
      uVar9 = 0;
      uVar6 = (ulong)(uint)this->m_atoms_count;
      if (this->m_atoms_count < 1) {
        uVar6 = uVar9;
      }
      for (; uVar6 * 0x30 - uVar9 != 0; uVar9 = uVar9 + 0x30) {
        Atom::ShallowCopy((Atom *)((long)&pAVar10->m_string_uid + uVar9),
                          (Atom *)((long)&pAVar1->m_string_uid + uVar9));
      }
      if (pAVar10 != (Atom *)0x0) {
        if (*(long *)&pAVar10[-1].m_displays_size != 0) {
          lVar8 = *(long *)&pAVar10[-1].m_displays_size * 0x30;
          do {
            Atom::~Atom((Atom *)((long)&pAVar10[-1].m_string_uid + lVar8));
            lVar8 = lVar8 + -0x30;
          } while (lVar8 != 0);
        }
        operator_delete__(&pAVar10[-1].m_displays_size);
      }
      this->m_atoms = pAVar1;
      this->m_atoms_size = iVar7;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool Chapters::Edition::ExpandAtomsArray() {
  if (m_atoms_size > m_atoms_count)
    return true;  // nothing else to do

  const int size = (m_atoms_size == 0) ? 1 : 2 * m_atoms_size;

  Atom* const atoms = new (std::nothrow) Atom[size];

  if (atoms == NULL)
    return false;

  for (int idx = 0; idx < m_atoms_count; ++idx) {
    m_atoms[idx].ShallowCopy(atoms[idx]);
  }

  delete[] m_atoms;
  m_atoms = atoms;

  m_atoms_size = size;
  return true;
}